

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

BGwCI_sharedPtr __thiscall
BayesianGameWithClusterInfo::ConstructExtendedBGWCI
          (BayesianGameWithClusterInfo *this,BGwCI_constPtr *pBG,JointPolicyDiscretePure *prevJPolBG
          ,QFunctionJAOHInterface *q)

{
  Index IVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  PlanningUnitDecPOMDPDiscrete *pu;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  reference pvVar5;
  undefined4 extraout_var_00;
  BayesianGameWithClusterInfo *this_00;
  undefined4 extraout_var_01;
  shared_count extraout_RDX;
  element_type *peVar6;
  uint uVar7;
  ulong __n;
  BGwCI_sharedPtr BVar8;
  shared_ptr<JointPolicyDiscretePure> prevJPolBGptr;
  shared_ptr<const_JointPolicyDiscretePure> local_68;
  QFunctionJAOHInterface *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  
  IVar1 = (pBG->px->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
          _m_t;
  local_50 = q;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nrTypes,&(pBG->px->super_BayesianGameForDecPOMDPStage).
                       super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
                       super_BayesianGameBase._m_nrTypes);
  uVar7 = 0;
  while( true ) {
    iVar3 = (*(pBG->px->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&(pBG->px->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff);
    __n = (ulong)uVar7;
    if (CONCAT44(extraout_var,iVar3) <= __n) break;
    pMVar2 = (((pBG->px->super_BayesianGameForDecPOMDPStage)._m_pu)->super_PlanningUnitMADPDiscrete)
             ._m_madp;
    lVar4 = (**(code **)((long)*pMVar2 + 0xc0))(pMVar2,__n);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&nrTypes,__n);
    uVar7 = uVar7 + 1;
    *pvVar5 = lVar4 * *pvVar5;
  }
  iVar3 = (*(prevJPolBG->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[5])
                    (prevJPolBG);
  boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyDiscretePure>
            (&prevJPolBGptr,(JointPolicyDiscretePure *)CONCAT44(extraout_var_00,iVar3));
  this_00 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
  peVar6 = pBG->px;
  pu = (peVar6->super_BayesianGameForDecPOMDPStage)._m_pu;
  local_68.px = &(prevJPolBGptr.px)->super_JointPolicyDiscretePure;
  local_68.pn.pi_ = prevJPolBGptr.pn.pi_;
  if (prevJPolBGptr.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (prevJPolBGptr.pn.pi_)->use_count_ = (prevJPolBGptr.pn.pi_)->use_count_ + 1;
    UNLOCK();
    peVar6 = pBG->px;
  }
  iVar3 = (*(peVar6->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])
                    (&(peVar6->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff
                    );
  peVar6 = pBG->px;
  BayesianGameWithClusterInfo
            (this_00,pu,local_50,IVar1 + 1,pBG,&local_68,CONCAT44(extraout_var_01,iVar3),
             &(peVar6->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrActions,
             &nrTypes,peVar6->_m_clusterAlgorithm,peVar6->_m_thresholdJB,peVar6->_m_thresholdPjaoh);
  boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
            ((shared_ptr<BayesianGameWithClusterInfo> *)this,this_00);
  boost::detail::shared_count::~shared_count(&local_68.pn);
  Extend((BayesianGameWithClusterInfo *)
         (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
         _vptr_BayesianGameForDecPOMDPStageInterface);
  boost::detail::shared_count::~shared_count(&prevJPolBGptr.pn);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  BVar8.pn.pi_ = extraout_RDX.pi_;
  BVar8.px = this;
  return BVar8;
}

Assistant:

BGwCI_sharedPtr 
BayesianGameWithClusterInfo::ConstructExtendedBGWCI(
        const BGwCI_constPtr &pBG,
        const JointPolicyDiscretePure& prevJPolBG,
        //const JointPolicyPureVector& prevJPolBG,
        const QFunctionJAOHInterface* q
 )
{
    //compute extended individual histories for each agent
    Index t = pBG->GetStage()+1;
    vector<size_t> nrTypes = pBG->GetNrTypes();   
    //each agent will form newtype = <type, action, observation>
    //tuples. Since the action is fixed (by prevJPolBG), the number of new
    //types for agent i is: nrTypes_i * nrObservations_i
    for(Index agI=0; agI < pBG->GetNrAgents(); agI++)
        nrTypes.at(agI) *= pBG->GetPUDecPOMDPDiscrete()->GetNrObservations(agI);

    boost::shared_ptr<JointPolicyDiscretePure> prevJPolBGptr=
        boost::shared_ptr<JointPolicyDiscretePure>(prevJPolBG.Clone());
    BGwCI_sharedPtr bg(new BayesianGameWithClusterInfo(
                           pBG->GetPUDecPOMDPDiscrete(), q, t,
                           pBG,
                           prevJPolBGptr, 
                           pBG->GetNrAgents(),
                           pBG->GetNrActions(),
                           nrTypes,
                           pBG->GetClusterAlgorithm(),
                           pBG->GetThresholdJB(),
                           pBG->GetThresholdPjaoh()
                           ));

    bg->Extend();
    //return the newly constructed bg
    return(bg);
}